

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

size_t jessilib::make_map_start_action<char16_t,jessilib::json_context<char16_t,true>>
                 (json_context<char16_t,_true> *inout_context,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> *inout_read_view)

{
  bool bVar1;
  const_reference pvVar2;
  size_t sVar3;
  invalid_argument *piVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_R8;
  decode_result dVar5;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_198;
  size_t local_188;
  char16_t *pcStack_180;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_178;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_168;
  string local_158;
  mapped_type *local_138;
  mapped_type *value;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_128;
  size_t local_118;
  char16_t *pcStack_110;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_108;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_f8;
  string local_e8;
  undefined4 local_c8;
  object local_b8;
  value_type_conflict3 local_72;
  undefined1 local_70 [6];
  char16_t front;
  KeyContext<true> key_context;
  map_type result;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *inout_read_view_local;
  json_context<char16_t,_true> *inout_context_local;
  
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
         *)((long)&key_context.out_object.field_2 + 8));
  advance_whitespace<char16_t>(inout_read_view);
  KeyContext<true>::KeyContext((KeyContext<true> *)local_70);
  while (bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                           (inout_read_view), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front(inout_read_view);
    local_72 = *pvVar2;
    if (local_72 == L'}') {
      std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix
                (inout_read_view,1);
      object::
      object<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                (&local_b8,
                 (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                  *)((long)&key_context.out_object.field_2 + 8));
      object::operator=(inout_context->out_object,&local_b8);
      object::~object(&local_b8);
      inout_context_local = (json_context<char16_t,_true> *)0x1;
LAB_002b343a:
      local_c8 = 1;
      KeyContext<true>::~KeyContext((KeyContext<true> *)local_70);
      std::
      map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
      ::~map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              *)((long)&key_context.out_object.field_2 + 8));
      return (size_t)inout_context_local;
    }
    if (local_72 != L'\"') {
      value._7_1_ = 1;
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_f8 = sv("Invalid JSON data; unexpected token: \'",0x26);
      local_118 = inout_read_view->_M_len;
      pcStack_110 = inout_read_view->_M_str;
      dVar5 = decode_codepoint<char16_t>(*inout_read_view);
      local_108._M_str = (char8_t *)dVar5.units;
      local_108._M_len._0_4_ = dVar5.codepoint;
      local_128 = sv("\' when parsing object map (expected \'\"\' instead)",0x30);
      join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                (&local_e8,(jessilib *)&local_f8,&local_108,(char32_t *)&local_128,in_R8);
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_e8);
      value._7_1_ = 0;
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix(inout_read_view,1);
    sVar3 = string_start_action<char16_t,jessilib::KeyContext<true>>
                      ((KeyContext<true> *)local_70,inout_read_view);
    if (sVar3 != 1) {
      inout_context_local =
           (json_context<char16_t,_true> *)std::numeric_limits<unsigned_long>::max();
      goto LAB_002b343a;
    }
    advance_whitespace<char16_t>(inout_read_view);
    local_138 = std::
                map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                              *)((long)&key_context.out_object.field_2 + 8),(key_type *)local_70);
    bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty(inout_read_view);
    if (bVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "Invalid JSON data; unexpected end of data after parsing map key; expected \':\' followed by value"
                );
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar2 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front(inout_read_view);
    local_72 = *pvVar2;
    if (local_72 != L':') {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_168 = sv("Invalid JSON data; unexpected token: \'",0x26);
      local_188 = inout_read_view->_M_len;
      pcStack_180 = inout_read_view->_M_str;
      dVar5 = decode_codepoint<char16_t>(*inout_read_view);
      local_178._M_str = (char8_t *)dVar5.units;
      local_178._M_len._0_4_ = dVar5.codepoint;
      local_198 = sv("\' when parsing map key (expected \':\' instead)",0x2d);
      join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                (&local_158,(jessilib *)&local_168,&local_178,(char32_t *)&local_198,in_R8);
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_158);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix(inout_read_view,1);
    bVar1 = deserialize_json<char16_t,_true,_&jessilib::fail_action>(local_138,inout_read_view);
    if (!bVar1) break;
    advance_whitespace<char16_t>(inout_read_view);
    bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty(inout_read_view);
    if (bVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "Invalid JSON data; unexpected end of data after parsing map value; expected \'}\'"
                );
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar2 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front(inout_read_view);
    if (*pvVar2 == L',') {
      std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix
                (inout_read_view,1);
      advance_whitespace<char16_t>(inout_read_view);
    }
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar4,
             "Invalid JSON data: unexpected end of data when parsing object array; expected \'}\'");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t make_map_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	using namespace std::literals;
	object::map_type result;

	advance_whitespace(inout_read_view);
	KeyContext<ContextT::use_exceptions> key_context;
	while (!inout_read_view.empty()) {
		// inout_read_view now points to either the start of a key, the end of the object, or invalid data
		CharT front = inout_read_view.front();
		if (front == '}') {
			// End of object
			inout_read_view.remove_prefix(1);
			inout_context.out_object = object{ std::move(result) }; // TODO: fix move semantics here
			return 1;
		}

		// Assert that we've reached the start of a key
		if (front != '\"') {
			if constexpr (ContextT::use_exceptions) {
				throw std::invalid_argument{
					jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
					decode_codepoint(inout_read_view).codepoint,
					u8"' when parsing object map (expected '\"' instead)"sv) };
			}

			return std::numeric_limits<size_t>::max();
		}

		// Read in key
		inout_read_view.remove_prefix(1); // front quote
		// TODO: really should be using the escape sequencing method instead of this
		if (string_start_action<CharT, decltype(key_context)>(key_context, inout_read_view) != 1) {
			// Failed to find end of string; any exception would've been thrown in string_start_action
			return std::numeric_limits<size_t>::max();
		}
		advance_whitespace(inout_read_view);

		// Insert our value object
		auto& value = result[key_context.out_object];

		// Verify next character is ':'
		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map key; expected ':' followed by value" };
		}
		front = inout_read_view.front();
		if (front != ':') {
			throw std::invalid_argument{
				jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
				decode_codepoint(inout_read_view).codepoint,
				u8"' when parsing map key (expected ':' instead)"sv) };
		}
		inout_read_view.remove_prefix(1); // strip ':'

		// We've reached an object value; parse it
		if (!deserialize_json<CharT, ContextT::use_exceptions>(value, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}

		// Advance through whitespace to ',' or '}'
		advance_whitespace(inout_read_view);

		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map value; expected '}'" };
		}

		if (inout_read_view.front() == ',') {
			// Strip comma and trailing whitespace
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);
		}
	}

	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected '}'" };
	}

	return std::numeric_limits<size_t>::max();
}